

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O3

int OBJ_sn2nid(char *s)

{
  int iVar1;
  void *pvVar2;
  ushort *puVar3;
  ASN1_OBJECT templ;
  char *local_38 [5];
  
  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if ((global_added_by_short_name != (lhash_st_ASN1_OBJECT *)0x0) &&
     (local_38[0] = s,
     pvVar2 = OPENSSL_lh_retrieve((_LHASH *)global_added_by_short_name,local_38,
                                  lh_ASN1_OBJECT_call_hash_func,lh_ASN1_OBJECT_call_cmp_func),
     pvVar2 != (void *)0x0)) {
    CRYPTO_MUTEX_unlock_read(&global_added_lock);
    return *(int *)((long)pvVar2 + 0x10);
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);
  puVar3 = (ushort *)bsearch(s,kNIDsInShortNameOrder,0x3ba,2,short_name_cmp);
  if (puVar3 == (ushort *)0x0) {
    iVar1 = 0;
  }
  else {
    if (0x3c4 < *puVar3 - 1) {
      abort();
    }
    iVar1 = kObjects[*puVar3 - 1].nid;
  }
  return iVar1;
}

Assistant:

int OBJ_sn2nid(const char *short_name) {
  CRYPTO_MUTEX_lock_read(&global_added_lock);
  if (global_added_by_short_name != NULL) {
    ASN1_OBJECT *match, templ;

    templ.sn = short_name;
    match = lh_ASN1_OBJECT_retrieve(global_added_by_short_name, &templ);
    if (match != NULL) {
      CRYPTO_MUTEX_unlock_read(&global_added_lock);
      return match->nid;
    }
  }
  CRYPTO_MUTEX_unlock_read(&global_added_lock);

  const uint16_t *nid_ptr = reinterpret_cast<const uint16_t *>(
      bsearch(short_name, kNIDsInShortNameOrder,
              OPENSSL_ARRAY_SIZE(kNIDsInShortNameOrder),
              sizeof(kNIDsInShortNameOrder[0]), short_name_cmp));
  if (nid_ptr == NULL) {
    return NID_undef;
  }

  return get_builtin_object(*nid_ptr)->nid;
}